

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isTexCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,float cmpReference,float result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FilterMode FVar5;
  long lVar6;
  int level;
  int layer;
  int coordZ;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  Vec2 local_80;
  Vec3 *local_78;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vec2 *local_40;
  Vec2 local_38;
  
  local_40 = lodBounds;
  fVar8 = TexVerifierUtil::computeFloatingPointError(coord->m_data[2],(prec->coordBits).m_data[2]);
  local_78 = (Vec3 *)CONCAT44(local_78._4_4_,fVar8);
  fVar8 = TexVerifierUtil::computeFixedPointError((prec->uvwBits).m_data[2]);
  fVar8 = fVar8 + local_78._0_4_;
  local_68 = CONCAT44(local_68._4_4_,fVar8 + coord->m_data[2]);
  local_78 = coord;
  fVar8 = floorf((coord->m_data[2] - fVar8) + 0.5);
  iVar2 = (int)fVar8;
  iVar7 = texture->m_numLevels;
  local_6c = -1;
  coordZ = local_6c;
  if (0 < iVar7) {
    coordZ = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar2 < coordZ) {
    coordZ = iVar2;
  }
  if (iVar2 < 0) {
    coordZ = 0;
  }
  fVar8 = floorf((float)local_68 + 0.5);
  iVar2 = (int)fVar8;
  if (0 < iVar7) {
    local_6c = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar2 < local_6c) {
    local_6c = iVar2;
  }
  if (iVar2 < 0) {
    local_6c = 0;
  }
  for (; coordZ <= local_6c; coordZ = coordZ + 1) {
    local_68 = *(undefined8 *)local_40->m_data;
    fVar8 = sampler->lodThreshold;
    uStack_60 = 0;
    if ((float)local_68 <= fVar8) {
      local_80.m_data = *(float (*) [2])local_78->m_data;
      local_58 = fVar8;
      bVar1 = isLevelCompareResultValid
                        (texture->m_levels,sampler,sampler->magFilter,prec,&local_80,coordZ,
                         cmpReference,result);
      fVar8 = local_58;
      if (bVar1) break;
    }
    if (fVar8 < local_68._4_4_) {
      FVar5 = sampler->minFilter;
      if (FVar5 - NEAREST_MIPMAP_NEAREST < 4) {
        local_58 = local_68._4_4_;
        fStack_54 = local_68._4_4_;
        fStack_50 = local_68._4_4_;
        fStack_4c = local_68._4_4_;
        iVar7 = texture->m_numLevels;
        switch(FVar5) {
        default:
          iVar7 = iVar7 + -1;
          fVar8 = ceilf((float)local_68 + 0.5);
          iVar3 = (int)fVar8 + -1;
          iVar2 = iVar7;
          if (iVar3 < iVar7) {
            iVar2 = iVar3;
          }
          if (iVar3 < 0) {
            iVar2 = 0;
          }
          fVar8 = floorf(local_58 + 0.5);
          iVar3 = (int)fVar8;
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
          }
          if (iVar3 < 0) {
            iVar7 = 0;
          }
          while (iVar2 <= iVar7) {
            uVar4 = sampler->minFilter - LINEAR;
            FVar5 = NEAREST;
            if (uVar4 < 5) {
              FVar5 = *(FilterMode *)(&DAT_00a49130 + (ulong)uVar4 * 4);
            }
            local_80.m_data = *(float (*) [2])local_78->m_data;
            bVar1 = isLevelCompareResultValid
                              (texture->m_levels + iVar2,sampler,FVar5,prec,&local_80,coordZ,
                               cmpReference,result);
            iVar2 = iVar2 + 1;
            if (bVar1) goto LAB_0097c452;
          }
          break;
        case NEAREST_MIPMAP_LINEAR:
        case LINEAR_MIPMAP_LINEAR:
          fVar8 = floorf((float)local_68);
          iVar3 = (int)fVar8;
          iVar7 = iVar7 + -2;
          iVar2 = iVar7;
          if (iVar3 < iVar7) {
            iVar2 = iVar3;
          }
          if (iVar3 < 0) {
            iVar2 = 0;
          }
          fVar8 = floorf(local_58);
          iVar3 = (int)fVar8;
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
          }
          if (iVar3 < 0) {
            iVar7 = 0;
          }
          while (iVar2 <= iVar7) {
            uVar4 = sampler->minFilter - LINEAR;
            FVar5 = NEAREST;
            if (uVar4 < 5) {
              FVar5 = *(FilterMode *)(&DAT_00a49130 + (ulong)uVar4 * 4);
            }
            fVar8 = (float)iVar2;
            auVar9._4_4_ = local_68._4_4_ - fVar8;
            auVar9._0_4_ = (float)local_68 - fVar8;
            auVar9._8_4_ = (float)uStack_60 - fVar8;
            auVar9._12_4_ = uStack_60._4_4_ - fVar8;
            auVar9 = minps(_DAT_009a4d00,auVar9);
            lVar6 = (long)iVar2;
            iVar2 = iVar2 + 1;
            local_80.m_data = *(float (*) [2])local_78->m_data;
            local_38.m_data[1] = (float)(-(uint)(0.0 <= local_68._4_4_ - fVar8) & auVar9._4_4_);
            local_38.m_data[0] = (float)(-(uint)(0.0 <= (float)local_68 - fVar8) & auVar9._0_4_);
            bVar1 = isMipmapLinearCompareResultValid
                              (texture->m_levels + lVar6,texture->m_levels + iVar2,sampler,FVar5,
                               prec,&local_80,coordZ,&local_38,cmpReference,result);
            if (bVar1) goto LAB_0097c452;
          }
        }
      }
      else {
        local_80.m_data = *(float (*) [2])local_78->m_data;
        bVar1 = isLevelCompareResultValid
                          (texture->m_levels,sampler,FVar5,prec,&local_80,coordZ,cmpReference,result
                          );
        if (bVar1) break;
      }
    }
  }
LAB_0097c452:
  return coordZ <= local_6c;
}

Assistant:

bool isTexCompareResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const TexComparePrecision& prec, const Vec3& coord, const Vec2& lodBounds, const float cmpReference, const float result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		const float		minLod			= lodBounds.x();
		const float		maxLod			= lodBounds.y();
		const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool		canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel < maxTexLevel);

			if (isLinearMipmap)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearCompareResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, Vec2(minF, maxF), cmpReference, result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelCompareResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, cmpReference, result))
						return true;
				}
			}
			else
			{
				if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
					return true;
			}
		}
	}

	return false;
}